

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_ByteTypeConstructor_Test::~ScriptElement_ByteTypeConstructor_Test
          (ScriptElement_ByteTypeConstructor_Test *this)

{
  ScriptElement_ByteTypeConstructor_Test *this_local;
  
  ~ScriptElement_ByteTypeConstructor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptElement, ByteTypeConstructor) {
  ScriptElement byte_elem = ScriptElement(ByteData("1234567890abcdef"));

  EXPECT_EQ(ScriptElementType::kElementBinary, byte_elem.GetType());
  EXPECT_EQ(ScriptOperator::OP_INVALIDOPCODE, byte_elem.GetOpCode());
  EXPECT_EQ(ByteData("1234567890abcdef").GetBytes(),
            byte_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(0, byte_elem.GetNumber());
  EXPECT_EQ(ByteData("081234567890abcdef").GetBytes(),
            byte_elem.GetData().GetBytes());
  EXPECT_STREQ("1234567890abcdef", byte_elem.ToString().c_str());
  EXPECT_TRUE(byte_elem.IsBinary());
  EXPECT_FALSE(byte_elem.IsNumber());
  EXPECT_FALSE(byte_elem.IsOpCode());
}